

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O2

ArrayCopy * __thiscall MixedArena::alloc<wasm::ArrayCopy>(MixedArena *this)

{
  ArrayCopy *pAVar1;
  
  pAVar1 = (ArrayCopy *)allocSpace(this,0x38,8);
  (pAVar1->super_SpecificExpression<(wasm::Expression::Id)77>).super_Expression._id = ArrayCopyId;
  (pAVar1->super_SpecificExpression<(wasm::Expression::Id)77>).super_Expression.type.id = 0;
  return pAVar1;
}

Assistant:

T* alloc() {
    static_assert(alignof(T) <= MAX_ALIGN,
                  "maximum alignment not large enough");
    auto* ret = static_cast<T*>(allocSpace(sizeof(T), alignof(T)));
    new (ret) T(*this); // allocated objects receive the allocator, so they can
                        // allocate more later if necessary
    return ret;
  }